

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
::_insert_chain(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
                *this,Tmp_column *column,Dimension dimension,Index pair)

{
  uint uVar1;
  pointer pIVar2;
  
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
  ::_container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
              *)this,column,this->nextIndex_,dimension);
  uVar1 = this->nextIndex_;
  pIVar2 = (this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2[uVar1].super_Chain_column_option.pairedColumn_ = pair;
  pIVar2[pair].super_Chain_column_option.pairedColumn_ = uVar1;
  this->nextIndex_ = uVar1 + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_insert_chain(const Tmp_column& column, Dimension dimension, Index pair)
{
  // true when no vine updates and if nextIndex_ is updated in remove_last for special case of no vines
  // because then @ref PosIdx == @ref MatIdx
  Pos_index pairPos = pair;

  _container_insert(column, nextIndex_, dimension);

  get_column(nextIndex_).assign_paired_chain(pair);
  auto& pairCol = get_column(pair);
  pairCol.assign_paired_chain(nextIndex_);

  if constexpr (Master_matrix::Option_list::has_column_pairings && Master_matrix::Option_list::has_vine_update) {
    pairPos = Swap_opt::CP::pivotToPosition_[pairCol.get_pivot()];
  }

  _update_barcode(pairPos);

  ++nextIndex_;
}